

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[15],unsigned_long,char[3],unsigned_long,char[25],char_const*,char[11],unsigned_long,char[30]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [15],unsigned_long *Args_1,
          char (*Args_2) [3],unsigned_long *Args_3,char (*Args_4) [25],char **Args_5,
          char (*Args_6) [11],unsigned_long *Args_7,char (*Args_8) [30])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[15],unsigned_long,char[3],unsigned_long,char[25],char_const*,char[11],unsigned_long,char[30]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [15])this,(unsigned_long *)Args,(char (*) [3])Args_1,(unsigned_long *)Args_2,
             (char (*) [25])Args_3,(char **)Args_4,(char (*) [11])Args_5,(unsigned_long *)Args_6,
             (char (*) [30])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}